

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RedBlackTree.cpp
# Opt level: O0

void __thiscall RedBlackTree::merge(RedBlackTree *this,RedBlackTree *RedBlackTree2)

{
  int iVar1;
  int iVar2;
  Node *local_70;
  Node *ptr_parent_1;
  Node *ptr_1;
  Node *ptr_parent;
  Node *ptr;
  int finalblackheight2;
  int finalblackheight1;
  int initialblackheight2;
  int initialblackheight1;
  Node *root2;
  Node *root1;
  Node *temp_ptr;
  Node *c;
  RedBlackTree *pRStack_18;
  int temp;
  RedBlackTree *RedBlackTree2_local;
  RedBlackTree *this_local;
  
  root2 = this->root;
  _initialblackheight2 = RedBlackTree2->root;
  pRStack_18 = RedBlackTree2;
  RedBlackTree2_local = this;
  finalblackheight1 = getBlackHeight(this,root2);
  finalblackheight2 = getBlackHeight(this,_initialblackheight2);
  if (finalblackheight2 < finalblackheight1) {
    temp_ptr = findMax(this,&root2);
    c._4_4_ = temp_ptr->value;
    removeElement(this,temp_ptr->value);
    root2 = this->root;
  }
  else if (finalblackheight1 < finalblackheight2) {
    temp_ptr = findMin(this,(Node **)&initialblackheight2);
    c._4_4_ = temp_ptr->value;
    removeElement(RedBlackTree2,temp_ptr->value);
    _initialblackheight2 = RedBlackTree2->root;
  }
  else {
    temp_ptr = findMin(this,(Node **)&initialblackheight2);
    c._4_4_ = temp_ptr->value;
    removeElement(RedBlackTree2,temp_ptr->value);
    iVar2 = finalblackheight1;
    _initialblackheight2 = RedBlackTree2->root;
    iVar1 = getBlackHeight(this,_initialblackheight2);
    if (iVar2 != iVar1) {
      insertElement(RedBlackTree2,temp_ptr->value);
      _initialblackheight2 = RedBlackTree2->root;
      temp_ptr = findMax(this,&root2);
      c._4_4_ = temp_ptr->value;
      removeElement(this,temp_ptr->value);
      root2 = this->root;
    }
  }
  setColor(this,&temp_ptr,0);
  ptr._4_4_ = getBlackHeight(this,root2);
  ptr._0_4_ = getBlackHeight(this,_initialblackheight2);
  if (ptr._4_4_ == (int)ptr) {
    temp_ptr->left = root2;
    root2->parent = temp_ptr;
    temp_ptr->right = _initialblackheight2;
    _initialblackheight2->parent = temp_ptr;
    setColor(this,&temp_ptr,1);
    temp_ptr->value = c._4_4_;
    this->root = temp_ptr;
  }
  else if (ptr._4_4_ < (int)ptr) {
    ptr_parent = _initialblackheight2;
    while (iVar2 = ptr._4_4_, iVar1 = getBlackHeight(this,ptr_parent), iVar2 != iVar1) {
      root1 = ptr_parent;
      ptr_parent = ptr_parent->left;
    }
    if (ptr_parent == (Node *)0x0) {
      ptr_1 = root1;
    }
    else {
      ptr_1 = ptr_parent->parent;
    }
    temp_ptr->left = root2;
    if (root2 != (Node *)0x0) {
      root2->parent = temp_ptr;
    }
    temp_ptr->right = ptr_parent;
    if (ptr_parent != (Node *)0x0) {
      ptr_parent->parent = temp_ptr;
    }
    ptr_1->left = temp_ptr;
    temp_ptr->parent = ptr_1;
    iVar2 = getColor(this,&ptr_1);
    if (iVar2 == 0) {
      fixInsert(this,&temp_ptr);
    }
    else {
      iVar2 = getColor(this,&ptr_parent);
      if (iVar2 == 0) {
        fixInsert(this,&ptr_parent);
      }
    }
    temp_ptr->value = c._4_4_;
    this->root = _initialblackheight2;
  }
  else {
    ptr_parent_1 = root2;
    while (iVar2 = (int)ptr, iVar1 = getBlackHeight(this,ptr_parent_1), iVar2 != iVar1) {
      ptr_parent_1 = ptr_parent_1->right;
    }
    local_70 = ptr_parent_1->parent;
    temp_ptr->right = _initialblackheight2;
    _initialblackheight2->parent = temp_ptr;
    temp_ptr->left = ptr_parent_1;
    ptr_parent_1->parent = temp_ptr;
    local_70->right = temp_ptr;
    temp_ptr->parent = local_70;
    iVar2 = getColor(this,&local_70);
    if (iVar2 == 0) {
      fixInsert(this,&temp_ptr);
    }
    else {
      iVar2 = getColor(this,&ptr_parent_1);
      if (iVar2 == 0) {
        fixInsert(this,&ptr_parent_1);
      }
    }
    temp_ptr->value = c._4_4_;
    this->root = root2;
  }
  return;
}

Assistant:

void RedBlackTree::merge(RedBlackTree RedBlackTree2) {
    int temp;
    Node *c, *temp_ptr;
    Node *root1 = root;
    Node *root2 = RedBlackTree2.root;

    int initialblackheight1 = getBlackHeight(root1);
    int initialblackheight2 = getBlackHeight(root2);
    if (initialblackheight1 > initialblackheight2) {
        c = findMax(root1);
        temp = c->value;
        removeElement(c->value);
        root1 = root;
    } else if (initialblackheight2 > initialblackheight1) {
        c = findMin(root2);
        temp = c->value;
        RedBlackTree2.removeElement(c->value);
        root2 = RedBlackTree2.root;
    } else {
        c = findMin(root2);
        temp = c->value;
        RedBlackTree2.removeElement(c->value);
        root2 = RedBlackTree2.root;
        if (initialblackheight1 != getBlackHeight(root2)) {
            RedBlackTree2.insertElement(c->value);
            root2 = RedBlackTree2.root;
            c = findMax(root1);
            temp = c->value;
            removeElement(c->value);
            root1 = root;
        }
    }
    setColor(c, RED);

    int finalblackheight1 = getBlackHeight(root1);
    int finalblackheight2 = getBlackHeight(root2);
    if (finalblackheight1 == finalblackheight2) {
        c->left = root1;
        root1->parent = c;
        c->right = root2;
        root2->parent = c;
        setColor(c, BLACK);
        c->value = temp;
        root = c;
    } else if (finalblackheight2 > finalblackheight1) {
        Node *ptr = root2;
        while (finalblackheight1 != getBlackHeight(ptr)) {
            temp_ptr = ptr;
            ptr = ptr->left;
        }
        Node *ptr_parent;
        if (ptr == nullptr) {
            ptr_parent = temp_ptr;
        } else {
            ptr_parent = ptr->parent;
        }
        c->left = root1;
        if (root1 != nullptr) {
            root1->parent = c;
        }
        c->right = ptr;
        if (ptr != nullptr) {
            ptr->parent = c;
        }
        ptr_parent->left = c;
        c->parent = ptr_parent;
        if (getColor(ptr_parent) == RED) {
            {
                fixInsert(c);
            }
        } else if (getColor(ptr) == RED) {
            fixInsert(ptr);
        }
        c->value = temp;
        root = root2;
    } else {
        Node *ptr = root1;
        while (finalblackheight2 != getBlackHeight(ptr)) {
            ptr = ptr->right;
        }
        Node *ptr_parent = ptr->parent;
        c->right = root2;
        root2->parent = c;
        c->left = ptr;
        ptr->parent = c;
        ptr_parent->right = c;
        c->parent = ptr_parent;
        if (getColor(ptr_parent) == RED) {
            fixInsert(c);
        } else if (getColor(ptr) == RED) {
            fixInsert(ptr);
        }
        c->value = temp;
        root = root1;
    }
}